

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

bool __thiscall
CommandLineArguments::addGroupDotNameFilter
          (CommandLineArguments *this,int ac,char **av,int *i,SimpleString *parameterName,
          bool strict,bool exclude)

{
  size_t sVar1;
  TestFilter *pTVar2;
  SimpleString *pSVar3;
  SimpleString *this_00;
  TestFilter *this_01;
  SimpleStringCollection collection;
  SimpleString groupDotName;
  SimpleString SStack_68;
  SimpleStringCollection local_58;
  
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,ac,(char **)(ulong)(uint)ac,
                    (int *)av,(SimpleString *)i);
  SimpleStringCollection::SimpleStringCollection(&local_58);
  SimpleString::SimpleString(&SStack_68,".");
  SimpleString::split((SimpleString *)&stack0xffffffffffffffc8,&SStack_68,&local_58);
  SimpleString::~SimpleString(&SStack_68);
  sVar1 = SimpleStringCollection::size(&local_58);
  if (sVar1 == 2) {
    pTVar2 = (TestFilter *)
             operator_new(0x20,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/CommandLineArguments.cpp"
                          ,0x136);
    pSVar3 = SimpleStringCollection::operator[](&local_58,0);
    this_00 = SimpleStringCollection::operator[](&local_58,0);
    SimpleString::size(this_00);
    SimpleString::subString(&SStack_68,(size_t)pSVar3,0);
    TestFilter::TestFilter(pTVar2,&SStack_68);
    SimpleString::~SimpleString(&SStack_68);
    this_01 = (TestFilter *)
              operator_new(0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/CommandLineArguments.cpp"
                           ,0x137);
    pSVar3 = SimpleStringCollection::operator[](&local_58,1);
    TestFilter::TestFilter(this_01,pSVar3);
    if (strict) {
      TestFilter::strictMatching(pTVar2);
      TestFilter::strictMatching(this_01);
    }
    if (exclude) {
      TestFilter::invertMatching(pTVar2);
      TestFilter::invertMatching(this_01);
    }
    pTVar2 = TestFilter::add(pTVar2,this->groupFilters_);
    this->groupFilters_ = pTVar2;
    pTVar2 = TestFilter::add(this_01,this->nameFilters_);
    this->nameFilters_ = pTVar2;
  }
  SimpleStringCollection::~SimpleStringCollection(&local_58);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  return sVar1 == 2;
}

Assistant:

bool CommandLineArguments::addGroupDotNameFilter(int ac, const char *const *av, int& i, const SimpleString& parameterName, 
                                                 bool strict, bool exclude)
{
    SimpleString groupDotName = getParameterField(ac, av, i, parameterName);
    SimpleStringCollection collection;
    groupDotName.split(".", collection);

    if (collection.size() != 2) return false;

    TestFilter* groupFilter = new TestFilter(collection[0].subString(0, collection[0].size()-1));
    TestFilter* nameFilter = new TestFilter(collection[1]);
    if (strict)
    {
        groupFilter->strictMatching();
        nameFilter->strictMatching();
    }
    if (exclude)
    {
        groupFilter->invertMatching();
        nameFilter->invertMatching();
    }
    groupFilters_ = groupFilter->add(groupFilters_);
    nameFilters_ = nameFilter->add(nameFilters_);
    return true;
}